

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

void __thiscall QSQLiteResultPrivate::initColumns(QSQLiteResultPrivate *this,bool emptyResultset)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  QChar *pQVar6;
  long *plVar7;
  QChar QVar8;
  int i;
  int N;
  long in_FS_OFFSET;
  QMetaType local_d0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QSqlField fld;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)&(this->super_QSqlCachedResultPrivate).field_0x8;
  iVar3 = sqlite3_column_count(this->stmt);
  if (0 < iVar3) {
    QSqlCachedResult::init((int)uVar2);
    for (N = 0; iVar3 != N; N = N + 1) {
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = (QChar *)sqlite3_column_name16(this->stmt,N);
      QString::QString((QString *)&fld,pQVar6,-1);
      QVar8.ucs = (char16_t)(QArrayDataPointer<char16_t> *)&fld;
      plVar7 = (long *)QString::remove(QVar8,0x22);
      local_88.d = (Data *)*plVar7;
      local_88.ptr = (char16_t *)plVar7[1];
      local_88.size = plVar7[2];
      if (local_88.d != (Data *)0x0) {
        LOCK();
        ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fld);
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = (QChar *)sqlite3_column_table_name16(this->stmt,N);
      QString::QString((QString *)&fld,pQVar6,-1);
      plVar7 = (long *)QString::remove(QVar8,0x22);
      local_a8.d = (Data *)*plVar7;
      local_a8.ptr = (char16_t *)plVar7[1];
      local_a8.size = plVar7[2];
      if (local_a8.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fld);
      local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = (QChar *)sqlite3_column_decltype16(this->stmt,N);
      QString::QString((QString *)&local_c8,pQVar6,-1);
      uVar5 = 0xfffffffe;
      if (!emptyResultset) {
        iVar4 = sqlite3_column_type(this->stmt,N);
        uVar5 = iVar4 - 1;
      }
      if ((undefined1 *)local_c8.size == (undefined1 *)0x0) {
        iVar4 = 0;
        if (uVar5 < 4) {
          iVar4 = *(int *)(&DAT_001e1020 + (ulong)uVar5 * 4);
        }
      }
      else {
        iVar4 = qGetColumnType((QString *)&local_c8);
      }
      _fld = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QMetaType::QMetaType(&local_d0,iVar4);
      QSqlField::QSqlField(&fld,(QString *)&local_88,local_d0,(QString *)&local_a8);
      QSqlRecord::append((QSqlField *)&this->rInf);
      QSqlField::~QSqlField(&fld);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSQLiteResultPrivate::initColumns(bool emptyResultset)
{
    Q_Q(QSQLiteResult);
    int nCols = sqlite3_column_count(stmt);
    if (nCols <= 0)
        return;

    q->init(nCols);

    for (int i = 0; i < nCols; ++i) {
        QString colName = QString(reinterpret_cast<const QChar *>(
                    sqlite3_column_name16(stmt, i))
                    ).remove(u'"');
        const QString tableName = QString(reinterpret_cast<const QChar *>(
                            sqlite3_column_table_name16(stmt, i))
                            ).remove(u'"');
        // must use typeName for resolving the type to match QSqliteDriver::record
        QString typeName = QString(reinterpret_cast<const QChar *>(
                    sqlite3_column_decltype16(stmt, i)));
        // sqlite3_column_type is documented to have undefined behavior if the result set is empty
        int stp = emptyResultset ? -1 : sqlite3_column_type(stmt, i);

        int fieldType;

        if (!typeName.isEmpty()) {
            fieldType = qGetColumnType(typeName);
        } else {
            // Get the proper type for the field based on stp value
            switch (stp) {
            case SQLITE_INTEGER:
                fieldType = QMetaType::Int;
                break;
            case SQLITE_FLOAT:
                fieldType = QMetaType::Double;
                break;
            case SQLITE_BLOB:
                fieldType = QMetaType::QByteArray;
                break;
            case SQLITE_TEXT:
                fieldType = QMetaType::QString;
                break;
            case SQLITE_NULL:
            default:
                fieldType = QMetaType::UnknownType;
                break;
            }
        }

        QSqlField fld(colName, QMetaType(fieldType), tableName);
        rInf.append(fld);
    }
}